

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void message_adddollar(t_message *x,t_floatarg f)

{
  t_atomtype local_2c;
  undefined1 local_28 [4];
  int n;
  t_atom a;
  t_floatarg f_local;
  t_message *x_local;
  
  local_2c = (t_atomtype)f;
  if ((int)local_2c < 0) {
    local_2c = A_NULL;
  }
  local_28 = (undefined1  [4])0x8;
  a.a_type = local_2c;
  a.a_w._4_4_ = f;
  binbuf_add((x->m_text).te_binbuf,1,(t_atom *)local_28);
  glist_retext(x->m_glist,&x->m_text);
  return;
}

Assistant:

static void message_adddollar(t_message *x, t_floatarg f)
{
    t_atom a;
    int n = f;
    if (n < 0)
        n = 0;
    SETDOLLAR(&a, n);
    binbuf_add(x->m_text.te_binbuf, 1, &a);
    glist_retext(x->m_glist, &x->m_text);
}